

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDLevel::UpdateEdgeTags(ON_SubDLevel *this,bool bUnsetEdgeTagsOnly)

{
  double dVar1;
  double dVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDVertex *pOVar4;
  ON_SubDVertex *pOVar5;
  uint uVar6;
  ON_SubDEdgeTag OVar7;
  ON_SubDEdge *this_00;
  ON_SubDEdgeTag OVar8;
  bool bVar9;
  uint local_4c;
  
  local_4c = 0;
  pOVar3 = this->m_edge[0];
LAB_005e8734:
  this_00 = pOVar3;
  if (this_00 == (ON_SubDEdge *)0x0) {
    return local_4c;
  }
  pOVar3 = this_00->m_next_edge;
  OVar8 = this_00->m_edge_tag;
  if ((this_00->m_face_count == 2) || ((OVar8 != SmoothX && (OVar8 != Smooth)))) goto LAB_005e876b;
  this_00->m_edge_tag = Unset;
  OVar8 = Unset;
  goto LAB_005e8774;
LAB_005e876b:
  if ((bUnsetEdgeTagsOnly) && (OVar8 != Unset)) goto LAB_005e8734;
LAB_005e8774:
  pOVar4 = this_00->m_vertex[0];
  if ((pOVar4 == (ON_SubDVertex *)0x0) ||
     (pOVar5 = this_00->m_vertex[1], pOVar5 == (ON_SubDVertex *)0x0)) {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
               ,0x4cf9,"","nullptr edge->m_vertex[] values");
    goto LAB_005e8734;
  }
  dVar1 = this_00->m_sector_coefficient[0];
  dVar2 = this_00->m_sector_coefficient[1];
  if (this_00->m_face_count != 2) {
    this_00->m_edge_tag = Crease;
switchD_005e8894_caseD_2:
    this_00->m_sector_coefficient[0] = 0.0;
    this_00->m_sector_coefficient[1] = 0.0;
    OVar7 = Crease;
    goto switchD_005e8894_caseD_3;
  }
  this_00->m_sector_coefficient[0] = -8883.0;
  this_00->m_sector_coefficient[1] = -8883.0;
  if (pOVar4->m_vertex_tag == Unset) {
    bVar9 = false;
  }
  else {
    bVar9 = pOVar5->m_vertex_tag != Unset;
  }
  uVar6 = ON_SubDEdge::TaggedEndIndex(this_00);
  if (uVar6 < 2) {
    this_00->m_sector_coefficient[uVar6] = 0.0;
  }
  OVar7 = OVar8;
  switch(OVar8) {
  case Unset:
    if (uVar6 == 2) {
LAB_005e88c2:
      this_00->m_edge_tag = SmoothX;
      OVar7 = SmoothX;
      goto switchD_005e8894_caseD_3;
    }
    if (!bVar9) {
      OVar7 = Unset;
      goto switchD_005e8894_caseD_3;
    }
    this_00->m_edge_tag = Smooth;
    OVar7 = Smooth;
    if (uVar6 != 3) goto switchD_005e8894_caseD_3;
    break;
  case Smooth:
    OVar7 = Smooth;
    if (uVar6 != 3) {
      if (uVar6 != 2) goto switchD_005e8894_caseD_3;
      goto LAB_005e88c2;
    }
    if (!bVar9) goto switchD_005e8894_caseD_3;
    break;
  case Crease:
    goto switchD_005e8894_caseD_2;
  default:
    goto switchD_005e8894_caseD_3;
  case SmoothX:
    OVar7 = SmoothX;
    if ((bool)(uVar6 != 2 & bVar9)) {
      this_00->m_edge_tag = Smooth;
      OVar7 = Smooth;
    }
    goto switchD_005e8894_caseD_3;
  }
  OVar7 = Smooth;
  this_00->m_sector_coefficient[0] = 0.0;
  this_00->m_sector_coefficient[1] = 0.0;
switchD_005e8894_caseD_3:
  if (OVar8 == OVar7) {
    if ((dVar1 == this_00->m_sector_coefficient[0]) &&
       (!NAN(dVar1) && !NAN(this_00->m_sector_coefficient[0]))) {
      if ((dVar2 == this_00->m_sector_coefficient[1]) &&
         (!NAN(dVar2) && !NAN(this_00->m_sector_coefficient[1]))) goto LAB_005e8734;
    }
  }
  local_4c = local_4c + 1;
  goto LAB_005e8734;
}

Assistant:

unsigned int ON_SubDLevel::UpdateEdgeTags(
  bool bUnsetEdgeTagsOnly
  )
{
  // Update edge flags and sector coefficients.
  unsigned int edge_change_count = 0;
  ON_SubDEdge* next_edge = m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);

    if (2 != edge->m_face_count && edge->IsSmooth())
    {
      // Dale Lear - Added April 5, 2021 - don't tolerate obvious errors / oversights.
      edge->m_edge_tag = ON_SubDEdgeTag::Unset;
    }

    const ON_SubDEdgeTag edge_tag0 = edge->m_edge_tag;
    if (bUnsetEdgeTagsOnly && ON_SubDEdgeTag::Unset != edge_tag0 )
    {
      continue;
    }

    if (nullptr == edge->m_vertex[0] || nullptr == edge->m_vertex[1])
    {
      ON_SUBD_ERROR("nullptr edge->m_vertex[] values");
      continue;
    }

    const double edge_sector_coefficient0[2] = { edge->m_sector_coefficient[0], edge->m_sector_coefficient[1] };

    if (2 != edge->m_face_count)
    {
      edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
      const bool bBothVertexTagsAreSet
        =  ON_SubDVertexTag::Unset != edge->m_vertex[0]->m_vertex_tag
        && ON_SubDVertexTag::Unset != edge->m_vertex[1]->m_vertex_tag
        ;
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (0 == tagged_end_index || 1 == tagged_end_index)
        edge->m_sector_coefficient[tagged_end_index] = ON_SubDSectorType::IgnoredSectorCoefficient;

      switch (edge_tag0)
      {
      case ON_SubDEdgeTag::Unset:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if ( bBothVertexTagsAreSet )
        {
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
          if (3 == tagged_end_index)
          {
            edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
            edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
          }
        }
        break;

      case ON_SubDEdgeTag::Smooth:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if (3 == tagged_end_index && bBothVertexTagsAreSet)
        {
          edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
          edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        }
        break;

      case ON_SubDEdgeTag::Crease:
        edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
        edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        break;

      case ON_SubDEdgeTag::SmoothX:
        if ( 2 != tagged_end_index && bBothVertexTagsAreSet)
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
        break;

      default:
        break;
      }
    }

    if (!(edge_tag0 == edge->m_edge_tag
      && edge_sector_coefficient0[0] == edge->m_sector_coefficient[0]
      && edge_sector_coefficient0[1] == edge->m_sector_coefficient[1]))
      edge_change_count++;
  }

  return edge_change_count;
}